

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.h
# Opt level: O2

void __thiscall vm_httpreq_cookie::~vm_httpreq_cookie(vm_httpreq_cookie *this)

{
  vm_httpreq_cookie *this_00;
  
  lib_free_str(this->name);
  lib_free_str(this->val);
  this_00 = this->nxt;
  if (this_00 != (vm_httpreq_cookie *)0x0) {
    ~vm_httpreq_cookie(this_00);
    operator_delete(this_00,0x18);
    return;
  }
  return;
}

Assistant:

~vm_httpreq_cookie()
    {
        lib_free_str(name);
        lib_free_str(val);
        if (nxt != 0)
            delete nxt;
    }